

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

uint32_t gravity_fiber_size(gravity_vm *vm,gravity_fiber_t *fiber)

{
  gravity_object_t *obj;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  gravity_value_t *pgVar5;
  
  (fiber->gc).visited = true;
  iVar4 = fiber->stackalloc * 0x10 + fiber->framesalloc * 0x30 + 0xa8;
  pgVar5 = fiber->stack;
  if (pgVar5 < fiber->stacktop) {
    do {
      obj = (pgVar5->field_1).p;
      _Var1 = gravity_value_isobject(*pgVar5);
      uVar2 = 0;
      if (_Var1) {
        uVar2 = gravity_object_size(vm,obj);
      }
      iVar4 = iVar4 + uVar2;
      pgVar5 = pgVar5 + 1;
    } while (pgVar5 < fiber->stacktop);
  }
  uVar2 = string_size(fiber->error);
  uVar3 = gravity_object_size(vm,(gravity_object_t *)fiber->caller);
  (fiber->gc).visited = false;
  return uVar3 + uVar2 + iVar4;
}

Assistant:

uint32_t gravity_fiber_size (gravity_vm *vm, gravity_fiber_t *fiber) {
    SET_OBJECT_VISITED_FLAG(fiber, true);
    
    // internal size
    uint32_t fiber_size = sizeof(gravity_fiber_t);
    fiber_size += fiber->stackalloc * sizeof(gravity_value_t);
    fiber_size += fiber->framesalloc * sizeof(gravity_callframe_t);

    // stack size
    for (gravity_value_t* slot = fiber->stack; slot < fiber->stacktop; ++slot) {
        fiber_size += gravity_value_size(vm, *slot);
    }

    fiber_size += string_size(fiber->error);
    fiber_size += gravity_object_size(vm, (gravity_object_t *)fiber->caller);

    SET_OBJECT_VISITED_FLAG(fiber, false);
    return fiber_size;
}